

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O2

void __thiscall
testing::
Action<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
::Action(Action<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
         *this,ActionInterface<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *impl)

{
  __shared_ptr<testing::ActionInterface<bool(std::__cxx11::string_const&)>,(__gnu_cxx::_Lock_policy)2>
  local_20 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  std::
  __shared_ptr<testing::ActionInterface<bool(std::__cxx11::string_const&)>,(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr<testing::ActionInterface<bool(std::__cxx11::string_const&)>,void>(local_20,impl);
  std::function<bool(std::__cxx11::string_const&)>::
  function<testing::Action<bool(std::__cxx11::string_const&)>::ActionAdapter,void>
            ((function<bool(std::__cxx11::string_const&)> *)this,(ActionAdapter *)local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  return;
}

Assistant:

explicit Action(ActionInterface<F>* impl)
      : fun_(ActionAdapter{::std::shared_ptr<ActionInterface<F>>(impl)}) {}